

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_revsurface.cpp
# Opt level: O1

ON__UINT32 __thiscall ON_RevSurface::DataCRC(ON_RevSurface *this,ON__UINT32 current_remainder)

{
  ON_Curve *pOVar1;
  ON__UINT32 OVar2;
  
  pOVar1 = this->m_curve;
  if (pOVar1 != (ON_Curve *)0x0) {
    current_remainder =
         (*(pOVar1->super_ON_Geometry).super_ON_Object._vptr_ON_Object[9])(pOVar1,current_remainder)
    ;
  }
  OVar2 = ON_CRC32(current_remainder,0x30,&this->m_axis);
  OVar2 = ON_CRC32(OVar2,0x10,&this->m_angle);
  OVar2 = ON_CRC32(OVar2,0x10,&this->m_t);
  OVar2 = ON_CRC32(OVar2,1,&this->m_bTransposed);
  return OVar2;
}

Assistant:

ON__UINT32 ON_RevSurface::DataCRC(ON__UINT32 current_remainder) const
{
  if ( m_curve )
    current_remainder = m_curve->DataCRC(current_remainder);
  current_remainder = ON_CRC32(current_remainder,sizeof(m_axis),&m_axis);
  current_remainder = ON_CRC32(current_remainder,sizeof(m_angle),&m_angle);
  current_remainder = ON_CRC32(current_remainder,sizeof(m_t),&m_t);
  current_remainder = ON_CRC32(current_remainder,sizeof(m_bTransposed),&m_bTransposed);
  return current_remainder;
}